

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O3

void duckdb_je_hpa_shard_set_deferral_allowed
               (tsdn_t *tsdn,hpa_shard_t *shard,_Bool deferral_allowed)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pthread_mutex_t *__mutex;
  _Bool _Var3;
  int iVar4;
  
  __mutex = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  _Var3 = (shard->opts).deferral_allowed;
  (shard->opts).deferral_allowed = deferral_allowed;
  if (_Var3 == true && !deferral_allowed) {
    hpa_shard_maybe_do_deferred_work(tsdn,shard,true);
  }
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
hpa_shard_set_deferral_allowed(tsdn_t *tsdn, hpa_shard_t *shard,
    bool deferral_allowed) {
	hpa_do_consistency_checks(shard);

	malloc_mutex_lock(tsdn, &shard->mtx);
	bool deferral_previously_allowed = shard->opts.deferral_allowed;
	shard->opts.deferral_allowed = deferral_allowed;
	if (deferral_previously_allowed && !deferral_allowed) {
		hpa_shard_maybe_do_deferred_work(tsdn, shard,
		    /* forced */ true);
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
}